

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAbbreviationDeclaration.cpp
# Opt level: O1

void __thiscall llvm::DWARFAbbreviationDeclaration::clear(DWARFAbbreviationDeclaration *this)

{
  (this->AttributeSpecs).super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
  super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>.
  super_SmallVectorBase.Size = 0;
  this->Code = 0;
  this->Tag = DW_TAG_null;
  this->CodeByteSize = '\0';
  this->HasChildren = false;
  if ((this->FixedAttributeSize).Storage.hasVal == true) {
    (this->FixedAttributeSize).Storage.hasVal = false;
  }
  return;
}

Assistant:

void DWARFAbbreviationDeclaration::clear() {
  Code = 0;
  Tag = DW_TAG_null;
  CodeByteSize = 0;
  HasChildren = false;
  AttributeSpecs.clear();
  FixedAttributeSize.reset();
}